

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O0

void __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
::basic_waitable_timer
          (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
           *this,executor_type *ex,duration *expiry_time)

{
  service_type *this_00;
  implementation_type *impl;
  undefined1 local_30 [8];
  error_code ec;
  duration *expiry_time_local;
  executor_type *ex_local;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *this_local;
  
  ec._M_cat = (error_category *)expiry_time;
  detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::io_object_impl(&this->impl_,0,ex);
  std::error_code::error_code((error_code *)local_30);
  this_00 = detail::
            io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
            ::get_service(&this->impl_);
  impl = detail::
         io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
         ::get_implementation(&this->impl_);
  detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::expires_after(this_00,impl,(duration_type *)ec._M_cat,(error_code *)local_30);
  detail::throw_error((error_code *)local_30,"expires_after");
  return;
}

Assistant:

basic_waitable_timer(const executor_type& ex, const duration& expiry_time)
    : impl_(0, ex)
  {
    asio::error_code ec;
    impl_.get_service().expires_after(
        impl_.get_implementation(), expiry_time, ec);
    asio::detail::throw_error(ec, "expires_after");
  }